

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::CmpHelperSTREQ
          (char *expected_expression,char *actual_expression,wchar_t *expected,wchar_t *actual)

{
  bool bVar1;
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  AssertionResult AVar3;
  wchar_t **in_stack_00000118;
  wchar_t *in_stack_ffffffffffffff68;
  string local_68 [32];
  string local_48 [39];
  undefined1 ignoring_case;
  char *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  ignoring_case = (undefined1)((ulong)in_R8 >> 0x38);
  expected_expression_00 = in_RDI;
  bVar1 = String::WideCStringEquals(in_stack_ffffffffffffff68,(wchar_t *)0x14c015);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    PrintToString<wchar_t_const*>(in_stack_00000118);
    PrintToString<wchar_t_const*>(in_stack_00000118);
    EqFailure(expected_expression_00,in_RSI,in_RDX,in_RCX,(bool)ignoring_case);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTREQ(const char* expected_expression,
                               const char* actual_expression,
                               const wchar_t* expected,
                               const wchar_t* actual) {
  if (String::WideCStringEquals(expected, actual)) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   PrintToString(expected),
                   PrintToString(actual),
                   false);
}